

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O1

FT_Error tt_property_get(FT_Module module,char *property_name,void *value)

{
  int iVar1;
  FT_Error FVar2;
  FT_UInt *val;
  
  iVar1 = strcmp(property_name,"interpreter-version");
  FVar2 = 0xc;
  if (iVar1 == 0) {
    *(undefined4 *)value = *(undefined4 *)&module[5].clazz;
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

static FT_Error
  tt_property_get( FT_Module    module,         /* TT_Driver */
                   const char*  property_name,
                   const void*  value )
  {
    FT_Error   error  = FT_Err_Ok;
    TT_Driver  driver = (TT_Driver)module;

    FT_UInt  interpreter_version = driver->interpreter_version;


    if ( !ft_strcmp( property_name, "interpreter-version" ) )
    {
      FT_UInt*  val = (FT_UInt*)value;


      *val = interpreter_version;

      return error;
    }

    FT_TRACE0(( "tt_property_get: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }